

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zuker.cpp
# Opt level: O2

void __thiscall Zuker::get_rna_cai(Zuker *this,string *rna)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pcVar5;
  int (*paiVar6) [3];
  long lVar7;
  int index;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  index = 0;
LAB_00133ae6:
  if (SBORROW4(index,this->n * 3) == index + this->n * -3 < 0) {
    return;
  }
  lVar9 = (long)index;
  piVar1 = (this->nucle_seq).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)piVar1[lVar9] == -1) goto LAB_00133b12;
  pcVar5 = to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start + piVar1[lVar9];
  goto LAB_00133ed9;
LAB_00133b12:
  iVar2 = index / 3;
  if (index % 3 == 0) {
    lVar8 = (long)index;
    lVar7 = lVar8 + 1;
    lVar11 = (long)piVar1[lVar8 + 1];
    lVar10 = lVar8 + 2;
    iVar4 = piVar1[lVar8 + 2];
    if (lVar11 == -1) {
      if (iVar4 == -1) {
        iVar4 = (this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2];
        iVar2 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2];
        if (iVar2 == -1) {
          iVar2 = max_cai_pos[iVar4];
        }
        paiVar6 = (int (*) [3])(nucleotides[iVar4][iVar2] + 2);
        (rna->_M_dataplus)._M_p[lVar9] =
             to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[nucleotides[iVar4][iVar2][0]];
        (rna->_M_dataplus)._M_p[lVar7] =
             to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[nucleotides[iVar4][iVar2][1]];
      }
      else {
        iVar3 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2];
        if (iVar3 == -1) {
          iVar3 = fill_rna(this,index);
        }
        (rna->_M_dataplus)._M_p[lVar10] =
             to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[iVar4];
        (rna->_M_dataplus)._M_p[lVar9] =
             to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[nucleotides
                       [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar2]][iVar3][0]];
        paiVar6 = (int (*) [3])
                  (nucleotides
                   [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar2]][iVar3] + 1);
        lVar10 = lVar7;
      }
    }
    else {
      iVar3 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar2];
      if (iVar4 == -1) {
        if (iVar3 == -1) {
          iVar3 = fill_rna(this,index);
        }
        (rna->_M_dataplus)._M_p[lVar7] =
             to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar11];
        (rna->_M_dataplus)._M_p[lVar9] =
             to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[nucleotides
                       [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar2]][iVar3][0]];
        paiVar6 = (int (*) [3])
                  (nucleotides
                   [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar2]][iVar3] + 2);
      }
      else {
        if (iVar3 == -1) {
          iVar3 = fill_rna(this,index);
        }
        (rna->_M_dataplus)._M_p[lVar7] =
             to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar11];
        (rna->_M_dataplus)._M_p[lVar8 + 2] =
             to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start[(this->nucle_seq).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8 + 2]];
        paiVar6 = nucleotides
                  [(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2]] + iVar3;
        lVar10 = lVar9;
      }
    }
    (rna->_M_dataplus)._M_p[lVar10] =
         to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[(*paiVar6)[0]];
    index = index + 3;
  }
  iVar2 = index / 3;
  if (index % 3 == 1) {
    lVar10 = (long)index;
    lVar9 = lVar10 + 1;
    lVar7 = (long)(this->nucle_seq).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar10 + 1];
    iVar4 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    if (lVar7 == -1) {
      if (iVar4 == -1) {
        iVar4 = fill_rna(this,index);
      }
      (rna->_M_dataplus)._M_p[index] =
           to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[*(int *)((long)iVar4 * 0xc +
                            (long)(this->protein).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar2] * 0x48 + 0x1ad084)
                   ];
      pcVar5 = to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start +
               *(int *)((long)iVar4 * 0xc +
                       (long)(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar2] * 0x48 + 0x1ad088);
    }
    else {
      if (iVar4 == -1) {
        iVar4 = fill_rna(this,index);
      }
      (rna->_M_dataplus)._M_p[lVar9] =
           to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar7];
      pcVar5 = to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start +
               *(int *)((long)iVar4 * 0xc +
                       (long)(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar2] * 0x48 + 0x1ad084);
      lVar9 = lVar10;
    }
    (rna->_M_dataplus)._M_p[lVar9] = *pcVar5;
    index = index + 2;
  }
  if (index % 3 == 2) {
    iVar2 = (this->codon_selection).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[index / 3];
    if (iVar2 == -1) {
      iVar2 = fill_rna(this,index);
    }
    pcVar5 = to_char.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
             ._M_start +
             *(int *)((long)iVar2 * 0xc +
                     (long)(this->protein).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[index / 3] * 0x48 + 0x1ad088);
    lVar9 = (long)index;
LAB_00133ed9:
    (rna->_M_dataplus)._M_p[lVar9] = *pcVar5;
    index = index + 1;
  }
  goto LAB_00133ae6;
}

Assistant:

void Zuker::get_rna_cai(string & rna) {


    int i = 0;
    while (i < 3*n) {
        if (nucle_seq[i] == -1) {
            if (i % 3 == 0) {
                if (nucle_seq[i+1] == -1 && nucle_seq[i+2] == -1) {
                    int p = protein[i/3];
                    int x = codon_selection[i/3];

                    if (x == -1)
                        x = max_cai_pos[p];
                    rna[i] = to_char[nucleotides[p][x][0]];
                    rna[i+1] = to_char[nucleotides[p][x][1]];
                    rna[i+2] = to_char[nucleotides[p][x][2]];
                    i = i+3;
                }
                else if (nucle_seq[i+1] == -1) {

                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+2] = to_char[nucle_seq[i+2]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][0]];
                    rna[i+1] = to_char[nucleotides[protein[i/3]][idx][1]];

                    i = i+3;
                }
                else if (nucle_seq[i+2] == -1) {
                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+1] = to_char[nucle_seq[i+1]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][0]];
                    rna[i+2] = to_char[nucleotides[protein[i/3]][idx][2]];

                    i = i+3;
                }
                else {
                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+1] = to_char[nucle_seq[i+1]];
                    rna[i+2] = to_char[nucle_seq[i+2]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][0]];

                    i = i+3;
                }
            }
            if (i % 3 == 1) {
                if (nucle_seq[i+1] == -1) {

                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][1]];
                    rna[i+1] = to_char[nucleotides[protein[i/3]][idx][2]];


                    i = i+2;
                } else {
                    int idx = codon_selection[i/3];
                    if (idx == -1)
                        idx = fill_rna(i);
                    rna[i+1] = to_char[nucle_seq[i+1]];
                    rna[i] = to_char[nucleotides[protein[i/3]][idx][1]];

                    i = i+2;
                }
            }
            if (i % 3 == 2) {

                int idx = codon_selection[i/3];
                if (idx == -1)
                    idx = fill_rna(i);
                rna[i] = to_char[nucleotides[protein[i/3]][idx][2]];

                i++;
            }
        }
        else {
            rna[i] = to_char[nucle_seq[i]];
            i++;
        }
    }
}